

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O0

int getPixelInterpolateWeight(gdImagePtr im,double x,double y,int bgColor)

{
  int x_00;
  int y_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  int local_90;
  int local_8c;
  int a;
  int b;
  int g;
  int r;
  int c4;
  int c3;
  int c2;
  int c1;
  double m4;
  double m3;
  double m2;
  double m1;
  double nyf;
  double nxf;
  double yf;
  double xf;
  int sy;
  int sx;
  int bgColor_local;
  double y_local;
  double x_local;
  gdImagePtr im_local;
  
  x_00 = (int)x;
  y_00 = (int)y;
  dVar1 = x - (double)x_00;
  dVar2 = y - (double)y_00;
  dVar3 = dVar1 * dVar2;
  dVar4 = (1.0 - dVar1) * dVar2;
  dVar5 = dVar1 * (1.0 - dVar2);
  dVar1 = (1.0 - dVar1) * (1.0 - dVar2);
  if (im->trueColor == 1) {
    local_94 = getPixelOverflowTC(im,x_00,y_00,bgColor);
  }
  else {
    local_94 = getPixelOverflowPalette(im,x_00,y_00,bgColor);
  }
  if (im->trueColor == 1) {
    local_98 = getPixelOverflowTC(im,x_00 + -1,y_00,bgColor);
  }
  else {
    local_98 = getPixelOverflowPalette(im,x_00 + -1,y_00,bgColor);
  }
  if (im->trueColor == 1) {
    local_9c = getPixelOverflowTC(im,x_00,y_00 + -1,bgColor);
  }
  else {
    local_9c = getPixelOverflowPalette(im,x_00,y_00 + -1,bgColor);
  }
  if (im->trueColor == 1) {
    local_a0 = getPixelOverflowTC(im,x_00 + -1,y_00 + -1,bgColor);
  }
  else {
    local_a0 = getPixelOverflowPalette(im,x_00,y_00 + -1,bgColor);
  }
  if (im->trueColor == 0) {
    dVar2 = dVar1 * (double)im->red[(int)local_a0] +
            dVar5 * (double)im->red[(int)local_9c] +
            dVar3 * (double)im->red[(int)local_94] + dVar4 * (double)im->red[(int)local_98];
    dVar6 = dVar1 * (double)im->green[(int)local_a0] +
            dVar5 * (double)im->green[(int)local_9c] +
            dVar3 * (double)im->green[(int)local_94] + dVar4 * (double)im->green[(int)local_98];
    dVar7 = dVar1 * (double)im->blue[(int)local_a0] +
            dVar5 * (double)im->blue[(int)local_9c] +
            dVar3 * (double)im->blue[(int)local_94] + dVar4 * (double)im->blue[(int)local_98];
    dVar1 = dVar1 * (double)im->alpha[(int)local_a0] +
            dVar5 * (double)im->alpha[(int)local_9c] +
            dVar3 * (double)im->alpha[(int)local_94] + dVar4 * (double)im->alpha[(int)local_98];
  }
  else {
    dVar2 = dVar1 * (double)((int)(local_a0 & 0xff0000) >> 0x10) +
            dVar5 * (double)((int)(local_9c & 0xff0000) >> 0x10) +
            dVar3 * (double)((int)(local_94 & 0xff0000) >> 0x10) +
            dVar4 * (double)((int)(local_98 & 0xff0000) >> 0x10);
    dVar6 = dVar1 * (double)((int)(local_a0 & 0xff00) >> 8) +
            dVar5 * (double)((int)(local_9c & 0xff00) >> 8) +
            dVar3 * (double)((int)(local_94 & 0xff00) >> 8) +
            dVar4 * (double)((int)(local_98 & 0xff00) >> 8);
    dVar7 = dVar1 * (double)(local_a0 & 0xff) +
            dVar5 * (double)(local_9c & 0xff) +
            dVar3 * (double)(local_94 & 0xff) + dVar4 * (double)(local_98 & 0xff);
    dVar1 = dVar1 * (double)((int)(local_a0 & 0x7f000000) >> 0x18) +
            dVar5 * (double)((int)(local_9c & 0x7f000000) >> 0x18) +
            dVar3 * (double)((int)(local_94 & 0x7f000000) >> 0x18) +
            dVar4 * (double)((int)(local_98 & 0x7f000000) >> 0x18);
  }
  b = (int)dVar2;
  a = (int)dVar6;
  local_8c = (int)dVar7;
  local_90 = (int)dVar1;
  if (b < 0x100) {
    if (b < 0) {
      local_a8 = 0;
    }
    else {
      local_a8 = b;
    }
    local_a4 = local_a8;
  }
  else {
    local_a4 = 0xff;
  }
  if (a < 0x100) {
    if (a < 0) {
      local_b0 = 0;
    }
    else {
      local_b0 = a;
    }
    local_ac = local_b0;
  }
  else {
    local_ac = 0xff;
  }
  if (local_8c < 0x100) {
    if (local_8c < 0) {
      local_b8 = 0;
    }
    else {
      local_b8 = local_8c;
    }
    local_b4 = local_b8;
  }
  else {
    local_b4 = 0xff;
  }
  if (local_90 < 0x80) {
    if (local_90 < 0) {
      local_c0 = 0;
    }
    else {
      local_c0 = local_90;
    }
    local_bc = local_c0;
  }
  else {
    local_bc = 0x7f;
  }
  return local_bc * 0x1000000 + local_a4 * 0x10000 + local_ac * 0x100 + local_b4;
}

Assistant:

static int getPixelInterpolateWeight(gdImagePtr im, const double x, const double y, const int bgColor)
{
	/* Closest pixel <= (xf,yf) */
	int sx = (int)(x);
	int sy = (int)(y);
	const double xf = x - (double)sx;
	const double yf = y - (double)sy;
	const double nxf = (double) 1.0 - xf;
	const double nyf = (double) 1.0 - yf;
	const double m1 = xf * yf;
	const double m2 = nxf * yf;
	const double m3 = xf * nyf;
	const double m4 = nxf * nyf;

	/* get color values of neighbouring pixels */
	const int c1 = im->trueColor == 1 ? getPixelOverflowTC(im, sx, sy, bgColor)         : getPixelOverflowPalette(im, sx, sy, bgColor);
	const int c2 = im->trueColor == 1 ? getPixelOverflowTC(im, sx - 1, sy, bgColor)     : getPixelOverflowPalette(im, sx - 1, sy, bgColor);
	const int c3 = im->trueColor == 1 ? getPixelOverflowTC(im, sx, sy - 1, bgColor)     : getPixelOverflowPalette(im, sx, sy - 1, bgColor);
	const int c4 = im->trueColor == 1 ? getPixelOverflowTC(im, sx - 1, sy - 1, bgColor) : getPixelOverflowPalette(im, sx, sy - 1, bgColor);
	int r, g, b, a;

	if (x < 0) sx--;
	if (y < 0) sy--;

	/* component-wise summing-up of color values */
	if (im->trueColor) {
		r = (int)(m1*gdTrueColorGetRed(c1)   + m2*gdTrueColorGetRed(c2)   + m3*gdTrueColorGetRed(c3)   + m4*gdTrueColorGetRed(c4));
		g = (int)(m1*gdTrueColorGetGreen(c1) + m2*gdTrueColorGetGreen(c2) + m3*gdTrueColorGetGreen(c3) + m4*gdTrueColorGetGreen(c4));
		b = (int)(m1*gdTrueColorGetBlue(c1)  + m2*gdTrueColorGetBlue(c2)  + m3*gdTrueColorGetBlue(c3)  + m4*gdTrueColorGetBlue(c4));
		a = (int)(m1*gdTrueColorGetAlpha(c1) + m2*gdTrueColorGetAlpha(c2) + m3*gdTrueColorGetAlpha(c3) + m4*gdTrueColorGetAlpha(c4));
	} else {
		r = (int)(m1*im->red[(c1)]   + m2*im->red[(c2)]   + m3*im->red[(c3)]   + m4*im->red[(c4)]);
		g = (int)(m1*im->green[(c1)] + m2*im->green[(c2)] + m3*im->green[(c3)] + m4*im->green[(c4)]);
		b = (int)(m1*im->blue[(c1)]  + m2*im->blue[(c2)]  + m3*im->blue[(c3)]  + m4*im->blue[(c4)]);
		a = (int)(m1*im->alpha[(c1)] + m2*im->alpha[(c2)] + m3*im->alpha[(c3)] + m4*im->alpha[(c4)]);
	}

	r = CLAMP(r, 0, 255);
	g = CLAMP(g, 0, 255);
	b = CLAMP(b, 0, 255);
	a = CLAMP(a, 0, gdAlphaMax);
	return gdTrueColorAlpha(r, g, b, a);
}